

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writeincludesbase.cpp
# Opt level: O0

void __thiscall WriteIncludesBase::acceptCustomWidget(WriteIncludesBase *this,DomCustomWidget *node)

{
  long lVar1;
  bool bVar2;
  DomCustomWidget *in_RDI;
  long in_FS_OFFSET;
  QString className;
  DomCustomWidget *in_stack_00000060;
  QString *in_stack_00000068;
  WriteIncludesBase *in_stack_00000070;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DomCustomWidget::elementClass(in_RDI);
  bVar2 = QString::isEmpty((QString *)0x197e36);
  if (!bVar2) {
    add(in_stack_00000070,in_stack_00000068,in_stack_00000060);
  }
  QString::~QString((QString *)0x197e57);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteIncludesBase::acceptCustomWidget(DomCustomWidget *node)
{
    const QString className = node->elementClass();
    if (!className.isEmpty())
        add(className, node);
}